

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

uint32_t helper_bcdsr_ppc(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,uint32_t ps)

{
  byte bVar1;
  char cVar2;
  _Bool _Var3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  _Bool ox_flag;
  ppc_avr_t ret;
  int local_40;
  int local_3c;
  ppc_avr_t bcd_one;
  
  ox_flag = false;
  bVar1 = b->u8[0];
  ret.u64[1] = b->u64[1];
  ret.u64[0] = b->u64[0] & 0xfffffffffffffff0;
  cVar2 = a->s8[8];
  iVar6 = (int)cVar2;
  bcd_one.u64[1] = 0;
  bcd_one.u64[0] = 0x10;
  _Var3 = bcd_is_valid(b);
  if (!_Var3) {
    return 1;
  }
  if (cVar2 < ' ') {
    if (cVar2 < -0x1f) {
      iVar6 = -0x1f;
    }
    else if ('\0' < cVar2) goto LAB_00955ab5;
    urshift(ret.u64,ret.u64 + 1,iVar6 * -4);
    uVar7 = 0;
    if (4 < (ret.u8[0] & 0xf)) {
      bcd_add_mag(&ret,&ret,&bcd_one,&local_40,&local_3c);
    }
  }
  else {
    iVar6 = 0x1f;
LAB_00955ab5:
    ulshift(ret.u64,ret.u64 + 1,iVar6 << 2,&ox_flag);
    uVar7 = (uint)ox_flag;
  }
  bVar5 = 0xd;
  if (((bVar1 & 0xf) - 0xb & 0xfd) != 0) {
    bVar5 = (ps != 0) * '\x03' | 0xc;
  }
  ret.u8[0] = ret.u8[0] & 0xf0 | bVar5;
  uVar4 = bcd_cmp_zero(&ret);
  r->u64[0] = ret.u64[0];
  r->u64[1] = ret.u64[1];
  return uVar4 | uVar7;
}

Assistant:

uint32_t helper_bcdsr(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b, uint32_t ps)
{
    int cr;
    int unused = 0;
    int invalid = 0;
    bool ox_flag = false;
    int sgnb = bcd_get_sgn(b);
    ppc_avr_t ret = *b;
    ret.VsrD(1) &= ~0xf;

    int i = a->VsrSB(7);
    ppc_avr_t bcd_one;

    bcd_one.VsrD(0) = 0;
    bcd_one.VsrD(1) = 0x10;

    if (bcd_is_valid(b) == false) {
        return CRF_SO;
    }

    if (unlikely(i > 31)) {
        i = 31;
    } else if (unlikely(i < -31)) {
        i = -31;
    }

    if (i > 0) {
        ulshift(&ret.VsrD(1), &ret.VsrD(0), i * 4, &ox_flag);
    } else {
        urshift(&ret.VsrD(1), &ret.VsrD(0), -i * 4);

        if (bcd_get_digit(&ret, 0, &invalid) >= 5) {
            bcd_add_mag(&ret, &ret, &bcd_one, &invalid, &unused);
        }
    }
    bcd_put_digit(&ret, bcd_preferred_sgn(sgnb, ps), 0);

    cr = bcd_cmp_zero(&ret);
    if (ox_flag) {
        cr |= CRF_SO;
    }
    *r = ret;

    return cr;
}